

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O2

int mbedtls_ssl_handshake_client_step(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  byte bVar2;
  mbedtls_key_exchange_type_t mVar3;
  mbedtls_ecp_group_id mVar4;
  mbedtls_x509_crt *pmVar5;
  mbedtls_ecp_group_id *pmVar6;
  mbedtls_ssl_session *pmVar7;
  char *__s;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint5 uVar11;
  uchar uVar12;
  ushort uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  mbedtls_pk_type_t mVar18;
  ulong uVar19;
  size_t sVar20;
  mbedtls_ssl_key_cert *pmVar21;
  mbedtls_pk_context *pmVar22;
  long lVar23;
  mbedtls_ssl_config *pmVar24;
  mbedtls_ecp_curve_info *pmVar25;
  uchar *puVar26;
  mbedtls_ssl_ciphersuite_t *pmVar27;
  time_t tVar28;
  int *piVar29;
  ulong uVar30;
  size_t sVar31;
  ushort uVar32;
  long lVar33;
  size_t sVar34;
  ulong uVar35;
  uchar *puVar36;
  mbedtls_md_type_t mVar37;
  char **ppcVar38;
  ulong uVar39;
  uchar *puVar40;
  int *piVar41;
  uchar *puVar42;
  mbedtls_ssl_handshake_params *pmVar43;
  long lVar44;
  bool bVar45;
  size_t sStackY_d0;
  ushort *local_b0;
  size_t n;
  uchar *local_a0;
  uchar *local_98;
  uchar *local_90;
  char *local_88;
  mbedtls_ssl_config *local_80;
  int major_ver;
  int local_68 [14];
  
  iVar15 = -0x7100;
  iVar16 = -0x7100;
  if (ssl->state == 0x10) {
    return -0x7100;
  }
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    return -0x7100;
  }
  iVar14 = mbedtls_ssl_flush_output(ssl);
  if (iVar14 != 0) {
    return iVar14;
  }
  if ((((ssl->conf->field_0x174 & 2) != 0) && (ssl->handshake->retransmit_state == '\x01')) &&
     (iVar14 = mbedtls_ssl_resend(ssl), iVar14 != 0)) {
    return iVar14;
  }
  switch(ssl->state) {
  case 0:
    ssl->state = 1;
    break;
  case 1:
    pmVar24 = ssl->conf;
    if (pmVar24->f_rng == (mbedtls_ssl_recv_t *)0x0) {
      return -0x7400;
    }
    if (ssl->renego_status == 0) {
      uVar13._0_1_ = pmVar24->min_major_ver;
      uVar13._1_1_ = pmVar24->min_minor_ver;
      uVar11 = CONCAT14(uVar13._1_1_,(uint)(uVar13 & 0xff));
      ssl->major_ver = (int)(ulong)uVar11;
      ssl->minor_ver = (int)((ulong)uVar11 >> 0x20);
    }
    if (pmVar24->max_major_ver == 0) {
      return -0x7100;
    }
    puVar36 = ssl->out_msg;
    mbedtls_ssl_write_version
              ((uint)pmVar24->max_major_ver,(uint)pmVar24->max_minor_ver,
               *(uint *)&pmVar24->field_0x174 >> 1 & 1,puVar36 + 4);
    pmVar43 = ssl->handshake;
    if (((ssl->conf->field_0x174 & 2) == 0) || (pmVar43->verify_cookie == (uchar *)0x0)) {
      tVar28 = time((time_t *)0x0);
      uVar17 = (uint)tVar28;
      *(uint *)pmVar43->randbytes =
           uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
      iVar15 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar43->randbytes + 4,0x1c);
      if (iVar15 != 0) {
        return iVar15;
      }
      pmVar43 = ssl->handshake;
    }
    uVar8 = *(undefined8 *)pmVar43->randbytes;
    uVar9 = *(undefined8 *)(pmVar43->randbytes + 8);
    uVar10 = *(undefined8 *)(pmVar43->randbytes + 0x18);
    *(undefined8 *)(puVar36 + 0x16) = *(undefined8 *)(pmVar43->randbytes + 0x10);
    *(undefined8 *)(puVar36 + 0x1e) = uVar10;
    *(undefined8 *)(puVar36 + 6) = uVar8;
    *(undefined8 *)(puVar36 + 0xe) = uVar9;
    pmVar7 = ssl->session_negotiate;
    sVar20 = pmVar7->id_len;
    if (sVar20 - 0x21 < 0xffffffffffffffef) {
      sVar20 = 0;
      if (ssl->renego_status == 0) {
LAB_00116a35:
        if ((pmVar7->ticket != (uchar *)0x0) && (pmVar7->ticket_len != 0)) {
          sVar20 = 0x20;
          iVar15 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar7->id,0x20);
          if (iVar15 != 0) {
            return iVar15;
          }
          ssl->session_negotiate->id_len = 0x20;
        }
      }
    }
    else {
      if (ssl->renego_status == 0) {
        if (ssl->handshake->resume == 0) {
          sVar20 = 0;
        }
        goto LAB_00116a35;
      }
      sVar20 = 0;
    }
    puVar36[0x26] = (uchar)sVar20;
    for (lVar23 = 0x28; lVar23 - sVar20 != 0x28; lVar23 = lVar23 + 1) {
      puVar36[lVar23 + -1] = ssl->session_negotiate->id[lVar23 + -0x28];
    }
    if ((ssl->conf->field_0x174 & 2) == 0) {
      puVar26 = puVar36 + lVar23 + -1;
    }
    else if (ssl->handshake->verify_cookie == (uchar *)0x0) {
      puVar26 = puVar36 + lVar23;
      puVar36[lVar23 + -1] = '\0';
    }
    else {
      puVar36[lVar23 + -1] = ssl->handshake->verify_cookie_len;
      memcpy(puVar36 + lVar23,ssl->handshake->verify_cookie,(ulong)ssl->handshake->verify_cookie_len
            );
      puVar26 = puVar36 + lVar23 + ssl->handshake->verify_cookie_len;
    }
    puVar42 = puVar26 + 2;
    uVar30 = 0;
    for (piVar41 = ssl->conf->ciphersuite_list[ssl->minor_ver]; *piVar41 != 0; piVar41 = piVar41 + 1
        ) {
      pmVar27 = mbedtls_ssl_ciphersuite_from_id(*piVar41);
      if (((((pmVar27 != (mbedtls_ssl_ciphersuite_t *)0x0) &&
            (pmVar24 = ssl->conf, pmVar27->min_minor_ver <= (int)(uint)pmVar24->max_minor_ver)) &&
           ((int)(uint)pmVar24->min_minor_ver <= pmVar27->max_minor_ver)) &&
          (((*(uint *)&pmVar24->field_0x174 & 2) == 0 || ((pmVar27->flags & 4) == 0)))) &&
         (((*(uint *)&pmVar24->field_0x174 & 0x40) == 0 ||
          (pmVar27->cipher != MBEDTLS_CIPHER_ARC4_128)))) {
        uVar30 = uVar30 + 1;
        *puVar42 = *(uchar *)((long)piVar41 + 1);
        puVar42[1] = (uchar)*piVar41;
        puVar42 = puVar42 + 2;
      }
    }
    if (ssl->renego_status == 0) {
      puVar42[0] = '\0';
      puVar42[1] = 0xff;
      puVar42 = puVar42 + 2;
      uVar30 = uVar30 + 1;
    }
    if ((ssl->conf->field_0x176 & 2) != 0) {
      puVar42[0] = 'V';
      puVar42[1] = '\0';
      puVar42 = puVar42 + 2;
      uVar30 = uVar30 + 1;
    }
    *puVar26 = (uchar)(uVar30 >> 7);
    puVar26[1] = (char)uVar30 * '\x02';
    puVar42[0] = '\x01';
    puVar42[1] = '\0';
    puVar26 = puVar42 + 4;
    local_b0 = (ushort *)ssl->out_msg;
    if (ssl->hostname == (char *)0x0) {
      uVar30 = 0;
    }
    else {
      sVar31 = strlen(ssl->hostname);
      if (((uchar *)((long)local_b0 + 0x4000) < puVar26) ||
         (uVar30 = sVar31 + 9, (ulong)(((long)local_b0 + 0x4000) - (long)puVar26) < uVar30)) {
        uVar30 = 0;
      }
      else {
        puVar42[4] = '\0';
        puVar42[5] = '\0';
        puVar42[6] = (uchar)(sVar31 + 5 >> 8);
        puVar42[7] = (uchar)(sVar31 + 5);
        puVar42[8] = (uchar)(sVar31 + 3 >> 8);
        puVar42[9] = (uchar)(sVar31 + 3);
        puVar42[10] = '\0';
        puVar42[0xb] = (uchar)(sVar31 >> 8);
        puVar42[0xc] = (uchar)sVar31;
        memcpy(puVar42 + 0xd,ssl->hostname,sVar31);
        local_b0 = (ushort *)ssl->out_msg;
      }
    }
    lVar23 = 0;
    if (ssl->renego_status == 1) {
      puVar1 = puVar26 + uVar30;
      if (puVar1 <= (uchar *)((long)local_b0 + 0x4000)) {
        if ((ulong)(((long)local_b0 + 0x4000) - (long)puVar1) < ssl->verify_data_len + 5) {
          lVar23 = 0;
        }
        else {
          puVar1[0] = 0xff;
          puVar1[1] = '\x01';
          puVar1[2] = '\0';
          puVar1[3] = (char)ssl->verify_data_len + '\x01';
          puVar1[4] = (uchar)ssl->verify_data_len;
          memcpy(puVar1 + 5,ssl->own_verify_data,ssl->verify_data_len);
          local_b0 = (ushort *)ssl->out_msg;
          lVar23 = ssl->verify_data_len + 5;
        }
      }
    }
    lVar23 = lVar23 + uVar30;
    pmVar24 = ssl->conf;
    local_a0 = puVar26;
    local_90 = puVar42;
    if (pmVar24->max_minor_ver == '\x03') {
      puVar26 = puVar26 + lVar23;
      piVar41 = pmVar24->sig_hashes;
      for (uVar30 = 6; *(int *)((long)piVar41 + (uVar30 - 6)) != 0; uVar30 = uVar30 + 4) {
      }
      if (((uchar *)((long)local_b0 + 0x4000) < puVar26) ||
         ((ulong)(((long)local_b0 + 0x4000) - (long)puVar26) < uVar30)) {
        lVar44 = 0;
      }
      else {
        for (lVar44 = 0; *(int *)((long)piVar41 + lVar44) != 0; lVar44 = lVar44 + 4) {
          uVar12 = mbedtls_ssl_hash_from_md_alg(*(int *)((long)piVar41 + lVar44));
          puVar42[lVar44 + lVar23 + 10] = uVar12;
          puVar42[lVar44 + lVar23 + 0xb] = '\x03';
          uVar12 = mbedtls_ssl_hash_from_md_alg(*(int *)((long)piVar41 + lVar44));
          puVar42[lVar44 + lVar23 + 0xc] = uVar12;
          puVar42[lVar44 + lVar23 + 0xd] = '\x01';
        }
        puVar26[0] = '\0';
        puVar26[1] = '\r';
        uVar12 = (uchar)((ulong)lVar44 >> 8);
        puVar26[2] = uVar12;
        puVar26[3] = (uchar)lVar44 + '\x02';
        puVar26[4] = uVar12;
        puVar26[5] = (uchar)lVar44;
        lVar44 = lVar44 + 6;
        pmVar24 = ssl->conf;
        local_b0 = (ushort *)ssl->out_msg;
      }
    }
    else {
      lVar44 = 0;
    }
    local_98 = local_90 + 2;
    lVar44 = lVar44 + lVar23;
    local_88 = (char *)(local_a0 + lVar44);
    pmVar6 = pmVar24->curve_list;
    uVar30 = 6;
    lVar23 = 0;
    while (puVar26 = local_90, mVar4 = *(mbedtls_ecp_group_id *)((long)pmVar6 + uVar30 * 2 + -0xc),
          mVar4 != MBEDTLS_ECP_DP_NONE) {
      pmVar25 = mbedtls_ecp_curve_info_from_grp_id(mVar4);
      if (pmVar25 == (mbedtls_ecp_curve_info *)0x0) goto LAB_00116e3c;
      uVar30 = uVar30 + 2;
    }
    if ((local_88 <= (uchar *)((long)local_b0 + 0x4000)) &&
       (uVar30 <= (ulong)(((long)local_b0 + 0x4000) - (long)local_88))) {
      pmVar6 = ssl->conf->curve_list;
      lVar23 = 6;
      while (mVar4 = *(mbedtls_ecp_group_id *)((long)pmVar6 + lVar23 * 2 + -0xc),
            mVar4 != MBEDTLS_ECP_DP_NONE) {
        pmVar25 = mbedtls_ecp_curve_info_from_grp_id(mVar4);
        puVar26[lVar23 + lVar44 + 4] = *(uchar *)((long)&pmVar25->tls_id + 1);
        puVar26[lVar23 + lVar44 + 5] = (uchar)pmVar25->tls_id;
        lVar23 = lVar23 + 2;
      }
      if (lVar23 != 6) {
        local_88[0] = '\0';
        local_88[1] = '\n';
        local_88[2] = (uchar)((ulong)(lVar23 + -4) >> 8);
        local_88[3] = (uchar)(lVar23 + -4);
        local_88[4] = (uchar)((ulong)(lVar23 + -6) >> 8);
        local_88[5] = (char)lVar23 + 0xfa;
        goto LAB_00116e3c;
      }
    }
    lVar23 = 0;
LAB_00116e3c:
    puVar26 = local_a0 + lVar23 + lVar44;
    puVar42 = ssl->out_msg;
    if ((ulong)((long)(puVar42 + 0x4000) - (long)puVar26) < 6 || puVar42 + 0x4000 < puVar26) {
      lVar33 = 0;
    }
    else {
      puVar26[0] = '\0';
      puVar26[1] = '\v';
      puVar26[2] = '\0';
      puVar26[3] = '\x02';
      puVar26[4] = '\x01';
      puVar26[5] = '\0';
      puVar42 = ssl->out_msg;
      lVar33 = 6;
    }
    lVar33 = lVar33 + lVar23 + lVar44;
    pmVar24 = ssl->conf;
    uVar17 = *(uint *)&pmVar24->field_0x174;
    if (((uVar17 & 0x380) == 0) ||
       (puVar26 = local_a0 + lVar33,
       (ulong)((long)(puVar42 + 0x4000) - (long)puVar26) < 5 || puVar42 + 0x4000 < puVar26)) {
      lVar23 = 0;
    }
    else {
      puVar26[0] = '\0';
      puVar26[1] = '\x01';
      puVar26[2] = '\0';
      puVar26[3] = '\x01';
      puVar26[4] = (byte)(*(uint *)&ssl->conf->field_0x174 >> 7) & 7;
      pmVar24 = ssl->conf;
      puVar42 = ssl->out_msg;
      uVar17 = *(uint *)&pmVar24->field_0x174;
      lVar23 = 5;
    }
    lVar23 = lVar23 + lVar33;
    if ((short)uVar17 < 0) {
      puVar26 = local_a0 + lVar23;
      lVar44 = 0;
      if ((puVar26 <= puVar42 + 0x4000) && (3 < (ulong)((long)(puVar42 + 0x4000) - (long)puVar26)))
      {
        puVar26[0] = '\0';
        puVar26[1] = '\x04';
        puVar26[2] = '\0';
        puVar26[3] = '\0';
        pmVar24 = ssl->conf;
        puVar42 = ssl->out_msg;
        uVar17 = *(uint *)&pmVar24->field_0x174;
        lVar44 = 4;
      }
    }
    else {
      lVar44 = 0;
    }
    lVar44 = lVar44 + lVar23;
    if (((uVar17 >> 10 & 1) == 0) || (pmVar24->max_minor_ver == '\0')) {
      lVar23 = 0;
    }
    else {
      puVar26 = local_a0 + lVar44;
      lVar23 = 0;
      if ((puVar26 <= puVar42 + 0x4000) && (3 < (ulong)((long)(puVar42 + 0x4000) - (long)puVar26)))
      {
        puVar26[0] = '\0';
        puVar26[1] = '\x16';
        puVar26[2] = '\0';
        puVar26[3] = '\0';
        pmVar24 = ssl->conf;
        puVar42 = ssl->out_msg;
        uVar17 = *(uint *)&pmVar24->field_0x174;
        lVar23 = 4;
      }
    }
    lVar23 = lVar23 + lVar44;
    if (((uVar17 >> 0xb & 1) == 0) || (pmVar24->max_minor_ver == '\0')) {
      lVar44 = 0;
    }
    else {
      puVar26 = local_a0 + lVar23;
      lVar44 = 0;
      if ((puVar26 <= puVar42 + 0x4000) && (3 < (ulong)((long)(puVar42 + 0x4000) - (long)puVar26)))
      {
        puVar26[0] = '\0';
        puVar26[1] = '\x17';
        puVar26[2] = '\0';
        puVar26[3] = '\0';
        pmVar24 = ssl->conf;
        puVar42 = ssl->out_msg;
        lVar44 = 4;
      }
    }
    puVar26 = (uchar *)(lVar44 + lVar23);
    ppcVar38 = pmVar24->alpn_list;
    if (ppcVar38 == (char **)0x0) {
      lVar23 = 0;
    }
    else {
      puVar1 = puVar26 + (long)local_a0;
      lVar23 = 0;
      local_88 = (char *)puVar26;
      local_80 = pmVar24;
      for (; *ppcVar38 != (char *)0x0; ppcVar38 = ppcVar38 + 1) {
        sVar31 = strlen(*ppcVar38);
        lVar23 = lVar23 + (sVar31 & 0xff) + 1;
      }
      puVar26 = (uchar *)local_88;
      pmVar24 = local_80;
      if (puVar42 + 0x4000 < puVar1) {
        lVar23 = 0;
      }
      else if ((ulong)((long)(puVar42 + 0x4000) - (long)puVar1) < lVar23 + 6U) {
        lVar23 = 0;
      }
      else {
        puVar1[0] = '\0';
        puVar1[1] = '\x10';
        puVar26 = puVar1 + 6;
        for (ppcVar38 = ssl->conf->alpn_list; *ppcVar38 != (char *)0x0; ppcVar38 = ppcVar38 + 1) {
          sVar31 = strlen(*ppcVar38);
          *puVar26 = (uchar)sVar31;
          memcpy(puVar26 + 1,*ppcVar38,sVar31 & 0xff);
          puVar26 = puVar26 + (sVar31 & 0xff) + 1;
        }
        lVar23 = (long)puVar26 - (long)puVar1;
        puVar1[4] = (uchar)((uint)((int)lVar23 + 0xfffa) >> 8);
        puVar1[5] = (char)lVar23 + 0xfa;
        puVar1[2] = (uchar)((uint)((int)lVar23 + 0xfffc) >> 8);
        puVar1[3] = (char)lVar23 + 0xfc;
        pmVar24 = ssl->conf;
        puVar42 = ssl->out_msg;
        puVar26 = (uchar *)local_88;
      }
    }
    puVar1 = local_a0;
    uVar30 = 0;
    if ((pmVar24->field_0x176 & 1) != 0) {
      puVar40 = local_a0 + (long)(puVar26 + lVar23);
      if (puVar40 <= puVar42 + 0x4000) {
        sVar31 = ssl->session_negotiate->ticket_len;
        uVar30 = sVar31 + 4;
        if ((ulong)((long)(puVar42 + 0x4000) - (long)puVar40) < uVar30) {
          uVar30 = 0;
        }
        else {
          puVar40[0] = '\0';
          puVar40[1] = '#';
          puVar40[2] = (uchar)(sVar31 >> 8);
          puVar40[3] = (uchar)sVar31;
          puVar42 = ssl->session_negotiate->ticket;
          if (sVar31 == 0 || puVar42 == (uchar *)0x0) {
            uVar30 = 4;
          }
          else {
            memcpy(puVar40 + 4,puVar42,sVar31);
          }
        }
      }
    }
    puVar42 = puVar26 + lVar23 + uVar30;
    puVar26 = local_98;
    if (puVar42 != (uchar *)0x0) {
      *(ushort *)(local_90 + 2) = (ushort)puVar42 << 8 | (ushort)puVar42 >> 8;
      puVar26 = puVar1 + (long)puVar42;
    }
    ssl->out_msglen = (long)puVar26 - (long)puVar36;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x01';
    ssl->state = ssl->state + 1;
    if ((ssl->conf->field_0x174 & 2) != 0) {
      mbedtls_ssl_send_flight_completed(ssl);
    }
    iVar15 = mbedtls_ssl_write_record(ssl);
    return iVar15;
  case 2:
    puVar36 = ssl->in_msg;
    iVar16 = mbedtls_ssl_read_record(ssl);
    if (iVar16 != 0) {
      return iVar16;
    }
    if (ssl->in_msgtype != 0x16) {
      if (ssl->renego_status == 1) {
        iVar15 = ssl->renego_records_seen;
        ssl->renego_records_seen = iVar15 + 1;
        iVar16 = ssl->conf->renego_max_records;
        if (iVar15 < iVar16 || iVar16 < 0) {
          ssl->keep_current_message = 1;
          return -0x6b00;
        }
        return -0x7700;
      }
      goto LAB_00117201;
    }
    uVar17 = *(uint *)&ssl->conf->field_0x174;
    if ((uVar17 & 2) == 0) {
      lVar23 = 4;
LAB_0011699d:
      if ((lVar23 + 0x26U <= ssl->in_hslen) && (*puVar36 == '\x02')) {
        puVar36 = puVar36 + lVar23;
        piVar41 = &ssl->minor_ver;
        mbedtls_ssl_read_version(&ssl->major_ver,piVar41,uVar17 >> 1 & 1,puVar36);
        pmVar24 = ssl->conf;
        if ((ssl->major_ver < (int)(uint)pmVar24->min_major_ver) ||
           (((*piVar41 < (int)(uint)pmVar24->min_minor_ver ||
             ((uint)pmVar24->max_major_ver < (uint)ssl->major_ver)) ||
            ((uint)pmVar24->max_minor_ver < (uint)*piVar41)))) {
LAB_00116a0c:
          mbedtls_ssl_send_alert_message(ssl,'\x02','F');
          return -0x6e80;
        }
        pmVar43 = ssl->handshake;
        uVar8 = *(undefined8 *)(puVar36 + 2);
        uVar9 = *(undefined8 *)(puVar36 + 10);
        uVar10 = *(undefined8 *)(puVar36 + 0x1a);
        *(undefined8 *)(pmVar43->randbytes + 0x30) = *(undefined8 *)(puVar36 + 0x12);
        *(undefined8 *)(pmVar43->randbytes + 0x38) = uVar10;
        *(undefined8 *)(pmVar43->randbytes + 0x20) = uVar8;
        *(undefined8 *)(pmVar43->randbytes + 0x28) = uVar9;
        uVar30 = (ulong)puVar36[0x22];
        if (uVar30 < 0x21) {
          puVar26 = (uchar *)ssl->in_hslen;
          uVar19 = (ulong)((ssl->conf->field_0x174 & 2) >> 1);
          lVar23 = uVar19 * 8 + 4;
          if ((uchar *)(uVar30 + uVar19 * 8 + 0x2b) < puVar26) {
            puVar42 = (uchar *)(ulong)(ushort)(*(ushort *)(puVar36 + uVar30 + 0x26) << 8 |
                                              *(ushort *)(puVar36 + uVar30 + 0x26) >> 8);
            if (((uchar *)0x2 < puVar42 + -1) && (puVar26 == puVar42 + lVar23 + uVar30 + 0x28)) {
LAB_001175b2:
              if (puVar36[uVar30 + 0x25] != '\0') {
                mbedtls_ssl_send_alert_message(ssl,'\x02','/');
                return -0x7080;
              }
              uVar17 = (uint)(ushort)(*(ushort *)(puVar36 + uVar30 + 0x23) << 8 |
                                     *(ushort *)(puVar36 + uVar30 + 0x23) >> 8);
              pmVar27 = mbedtls_ssl_ciphersuite_from_id(uVar17);
              ssl->transform_negotiate->ciphersuite_info = pmVar27;
              if (pmVar27 == (mbedtls_ssl_ciphersuite_t *)0x0) {
LAB_00117b5b:
                local_b0._0_1_ = 'P';
LAB_00116764:
                mbedtls_ssl_send_alert_message(ssl,'\x02',(uchar)local_b0);
                return iVar15;
              }
              mbedtls_ssl_optimize_checksum(ssl,pmVar27);
              pmVar43 = ssl->handshake;
              if (((uVar30 == 0) || (pmVar43->resume == 0)) ||
                 ((ssl->renego_status != 0 ||
                  ((((pmVar7 = ssl->session_negotiate, pmVar7->ciphersuite != uVar17 ||
                     (pmVar7->compression != 0)) || (pmVar7->id_len != uVar30)) ||
                   (iVar15 = bcmp(pmVar7->id,puVar36 + 0x23,uVar30), iVar15 != 0)))))) {
                ssl->state = ssl->state + 1;
                pmVar43->resume = 0;
                tVar28 = time((time_t *)0x0);
                pmVar7 = ssl->session_negotiate;
                pmVar7->start = tVar28;
                pmVar7->ciphersuite = uVar17;
                pmVar7->compression = 0;
                pmVar7->id_len = uVar30;
                memcpy(pmVar7->id,puVar36 + 0x23,uVar30);
              }
              else {
                ssl->state = 0xc;
                iVar15 = mbedtls_ssl_derive_keys(ssl);
                if (iVar15 != 0) goto LAB_00117b5b;
              }
              pmVar27 = mbedtls_ssl_ciphersuite_from_id(ssl->session_negotiate->ciphersuite);
              if ((pmVar27 == (mbedtls_ssl_ciphersuite_t *)0x0) ||
                 (((ssl->conf->field_0x174 & 0x40) != 0 &&
                  (pmVar27->cipher == MBEDTLS_CIPHER_ARC4_128)))) {
LAB_001176b1:
                uVar12 = '/';
              }
              else {
                piVar29 = ssl->conf->ciphersuite_list[*piVar41];
                do {
                  iVar15 = *piVar29;
                  if (iVar15 == 0) goto LAB_001176b1;
                  piVar29 = piVar29 + 1;
                } while (iVar15 != ssl->session_negotiate->ciphersuite);
                ssl->session_negotiate->compression = 0;
                local_b0 = (ushort *)(puVar36 + uVar30 + 0x28);
                local_88 = ssl->own_verify_data;
                local_80 = (mbedtls_ssl_config *)ssl->peer_verify_data;
                local_98 = (uchar *)0x0;
                while (puVar42 != (uchar *)0x0) {
                  uVar13 = local_b0[1] << 8 | local_b0[1] >> 8;
                  local_a0 = (uchar *)(ulong)(uVar13 + 4);
                  bVar45 = puVar42 < local_a0;
                  puVar42 = puVar42 + -(long)local_a0;
                  if (bVar45) goto LAB_001174bf;
                  uVar32 = *local_b0 << 8 | *local_b0 >> 8;
                  if (uVar32 == 1) {
                    if (((uVar13 != 1) ||
                        (uVar17 = *(uint *)&ssl->conf->field_0x174 >> 7 & 7, uVar17 == 0)) ||
                       (uVar17 != (byte)local_b0[2])) goto LAB_00117b38;
                  }
                  else if (uVar32 == 4) {
                    if ((uVar13 != 0) || ((*(uint *)&ssl->conf->field_0x174 & 0x8000) == 0))
                    goto LAB_00117b38;
                    ssl->session_negotiate->trunc_hmac = 1;
                  }
                  else if (uVar32 == 0xb) {
                    if ((ushort)((byte)local_b0[2] + 1) != uVar13) goto LAB_001174bf;
                    uVar30 = 0;
                    do {
                      if ((byte)local_b0[2] == uVar30) goto LAB_00117b38;
                      lVar23 = uVar30 + 5;
                      uVar30 = uVar30 + 1;
                      uVar17 = (uint)*(byte *)((long)local_b0 + lVar23);
                    } while (1 < uVar17);
                    (ssl->handshake->ecdh_ctx).point_format = uVar17;
                  }
                  else {
                    uVar17 = (uint)uVar13;
                    if (uVar32 == 0x10) {
                      ppcVar38 = ssl->conf->alpn_list;
                      if (ppcVar38 == (char **)0x0) goto LAB_00117b38;
                      if (((uVar17 < 4) ||
                          (uVar30 = (ulong)(ushort)(local_b0[2] << 8 | local_b0[2] >> 8),
                          uVar30 != (ulong)uVar17 - 2)) ||
                         (uVar19 = (ulong)(byte)local_b0[3], uVar30 - 1 != uVar19))
                      goto LAB_001174bf;
                      local_90 = (uchar *)((long)local_b0 + 7);
                      while( true ) {
                        __s = *ppcVar38;
                        if (__s == (char *)0x0) goto LAB_00117b38;
                        sVar31 = strlen(__s);
                        if ((sVar31 == uVar19) && (iVar15 = bcmp(local_90,__s,uVar19), iVar15 == 0))
                        break;
                        ppcVar38 = ppcVar38 + 1;
                      }
                      ssl->alpn_chosen = __s;
                    }
                    else if (uVar32 == 0x16) {
                      if ((((ssl->conf->field_0x175 & 4) == 0) || (uVar13 != 0)) || (*piVar41 == 0))
                      goto LAB_00117b38;
                      ssl->session_negotiate->encrypt_then_mac = 1;
                    }
                    else if (uVar32 == 0x17) {
                      if ((((ssl->conf->field_0x175 & 8) == 0) || (uVar13 != 0)) || (*piVar41 == 0))
                      goto LAB_00117b38;
                      ssl->handshake->extended_ms = 1;
                    }
                    else if (uVar32 == 0x23) {
                      if ((uVar13 != 0) || ((*(uint *)&ssl->conf->field_0x174 & 0x10000) == 0))
                      goto LAB_00117b38;
                      ssl->handshake->new_session_ticket = 1;
                    }
                    else if (uVar32 == 0xff01) {
                      if (ssl->renego_status == 0) {
                        if ((uVar13 == 1) && ((char)local_b0[2] == '\0')) {
                          ssl->secure_renegotiation = 1;
                          local_98 = (uchar *)0x1;
                          goto LAB_00117ad0;
                        }
                      }
                      else {
                        sVar20 = ssl->verify_data_len;
                        if ((sVar20 * 2 + 1 == (ulong)uVar17) &&
                           (sVar20 * 2 == (ulong)(byte)local_b0[2])) {
                          iVar15 = mbedtls_ssl_safer_memcmp
                                             ((void *)((long)local_b0 + 5),local_88,sVar20);
                          if (iVar15 == 0) {
                            iVar15 = mbedtls_ssl_safer_memcmp
                                               ((void *)((long)local_b0 + 5 + ssl->verify_data_len),
                                                local_80,ssl->verify_data_len);
                            local_98 = (uchar *)0x1;
                            if (iVar15 == 0) goto LAB_00117ad0;
                          }
                        }
                      }
                      goto LAB_00117b38;
                    }
                  }
LAB_00117ad0:
                  local_b0 = (ushort *)((long)local_b0 + (long)local_a0);
                  if ((uchar *)0xfffffffffffffffc < puVar42 + -4) {
                    return -0x7980;
                  }
                }
                iVar15 = ssl->secure_renegotiation;
                if ((iVar15 != 0) || ((*(uint *)&ssl->conf->field_0x174 & 0x30) != 0x20)) {
                  if (ssl->renego_status != 1) {
                    return 0;
                  }
                  if (iVar15 != 1 || (mbedtls_pk_type_t)local_98 != 0) {
                    if (iVar15 != 0) {
                      return 0;
                    }
                    if ((mbedtls_pk_type_t)local_98 != 1 && (ssl->conf->field_0x174 & 0x30) != 0) {
                      return 0;
                    }
                  }
                }
LAB_00117b38:
                uVar12 = '(';
              }
              goto LAB_001174c4;
            }
          }
          else if (puVar26 == (uchar *)(lVar23 + uVar30 + 0x26)) {
            puVar42 = (uchar *)0x0;
            goto LAB_001175b2;
          }
        }
      }
    }
    else {
      if (*puVar36 != '\x03') {
        free(ssl->handshake->verify_cookie);
        pmVar43 = ssl->handshake;
        pmVar43->verify_cookie = (uchar *)0x0;
        pmVar43->verify_cookie_len = '\0';
        uVar17 = *(uint *)&ssl->conf->field_0x174;
        lVar23 = (ulong)(uVar17 & 2) * 4 + 4;
        goto LAB_0011699d;
      }
      puVar36 = ssl->in_msg;
      mbedtls_ssl_read_version(&major_ver,(int *)&n,1,puVar36 + 0xc);
      if ((((int)(uint)n < 2 || major_ver < 3) || ((uint)ssl->conf->max_major_ver < (uint)major_ver)
          ) || (ssl->conf->max_minor_ver < (uint)n)) goto LAB_00116a0c;
      bVar2 = puVar36[0xe];
      uVar30 = (ulong)bVar2;
      if ((long)uVar30 <= (long)(ssl->in_msg + (ssl->in_msglen - (long)(puVar36 + 0xf)))) {
        free(ssl->handshake->verify_cookie);
        puVar26 = (uchar *)calloc(1,uVar30);
        pmVar43 = ssl->handshake;
        pmVar43->verify_cookie = puVar26;
        if (puVar26 == (uchar *)0x0) {
          return -0x7f00;
        }
        memcpy(puVar26,puVar36 + 0xf,uVar30);
        pmVar43->verify_cookie_len = bVar2;
        ssl->state = 1;
        mbedtls_ssl_reset_checksum(ssl);
        mbedtls_ssl_recv_flight_completed(ssl);
        break;
      }
    }
LAB_001174bf:
    uVar12 = '2';
LAB_001174c4:
    mbedtls_ssl_send_alert_message(ssl,'\x02',uVar12);
    return -0x7980;
  case 3:
    iVar15 = mbedtls_ssl_parse_certificate(ssl);
    return iVar15;
  case 4:
    pmVar27 = ssl->transform_negotiate->ciphersuite_info;
    if (pmVar27->key_exchange - MBEDTLS_KEY_EXCHANGE_ECDH_RSA < 2) {
      pmVar5 = ssl->session_negotiate->peer_cert;
      if (pmVar5 == (mbedtls_x509_crt *)0x0) {
        iVar15 = -0x7700;
      }
      else {
        iVar15 = mbedtls_pk_can_do(&pmVar5->pk,MBEDTLS_PK_ECKEY);
        if (iVar15 == 0) {
          iVar15 = -0x6d00;
        }
        else {
          iVar15 = mbedtls_ecdhopt_use_static_key
                             (&ssl->handshake->ecdh_ctx,
                              (mbedtls_ecp_keypair *)(ssl->session_negotiate->peer_cert->pk).pk_ctx,
                              MBEDTLS_ECDH_THEIRS);
          if (iVar15 == 0) {
            iVar16 = ssl_check_server_ecdh_params(ssl);
            iVar15 = -0x7a00;
            if (iVar16 == 0) goto LAB_001162d7;
          }
        }
      }
      local_b0._0_1_ = '(';
      goto LAB_00116764;
    }
    if (pmVar27->key_exchange != MBEDTLS_KEY_EXCHANGE_RSA) {
      iVar15 = mbedtls_ssl_read_record(ssl);
      if (iVar15 != 0) {
        return iVar15;
      }
      if (ssl->in_msgtype != 0x16) goto LAB_00117201;
      puVar36 = ssl->in_msg;
      if (*puVar36 == '\f') {
        uVar17 = *(uint *)&ssl->conf->field_0x174 & 2;
        n = (size_t)(puVar36 + (ulong)uVar17 * 4 + 4);
        puVar26 = puVar36 + ssl->in_hslen;
        mVar3 = pmVar27->key_exchange;
        if (mVar3 - MBEDTLS_KEY_EXCHANGE_PSK < 4) {
          if (puVar26 + -2 < n) goto LAB_001173e4;
          uVar30 = (ulong)(ushort)(*(ushort *)n << 8 | *(ushort *)n >> 8);
          if (puVar26 + -uVar30 < puVar36 + (ulong)uVar17 * 4 + 6) goto LAB_001173e4;
          n = (size_t)(puVar36 + (ulong)uVar17 * 4 + 6 + uVar30);
        }
        if (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK < mVar3) {
          return -0x6c00;
        }
        if ((0x118U >> (mVar3 & 0x1f) & 1) == 0) {
          if ((0x44U >> (mVar3 & 0x1f) & 1) == 0) {
            if ((0xa0U >> (mVar3 & 0x1f) & 1) == 0) {
              return -0x6c00;
            }
          }
          else {
            iVar15 = mbedtls_dhm_read_params(&ssl->handshake->dhm_ctx,(uchar **)&n,puVar26);
            if ((iVar15 != 0) ||
               ((ssl->handshake->dhm_ctx).len << 3 < (ulong)ssl->conf->dhm_min_bitlen))
            goto LAB_001173e4;
          }
        }
        else {
          iVar15 = mbedtls_ecdhopt_read_initiator(&ssl->handshake->ecdh_ctx,(uchar **)&n,puVar26);
          if ((iVar15 != 0) || (iVar15 = ssl_check_server_ecdh_params(ssl), iVar15 != 0)) {
LAB_001173e4:
            mbedtls_ssl_send_alert_message(ssl,'\x02','/');
            return -0x7b00;
          }
        }
        sVar20 = n;
        if (0xfffffffc < pmVar27->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK) {
          local_a0 = ssl->in_msg;
          local_90 = (uchar *)CONCAT71(local_90._1_7_,ssl->conf->field_0x174);
          if (ssl->minor_ver == 3) {
            iVar15 = -0x7b00;
            local_b0._0_1_ = '/';
            if ((puVar26 < (uchar *)(n + 2)) ||
               (mVar37 = mbedtls_ssl_md_alg_from_hash(*(uchar *)n), mVar37 == MBEDTLS_MD_NONE))
            goto LAB_00116764;
            mVar18 = mbedtls_ssl_pk_alg_from_sig(*(uchar *)(n + 1));
            local_98 = (uchar *)CONCAT44(local_98._4_4_,mVar18);
            if ((mVar18 == MBEDTLS_PK_NONE) ||
               (iVar16 = mbedtls_ssl_check_sig_hash(ssl,mVar37), iVar16 != 0)) goto LAB_00116764;
            n = n + 2;
            mVar18 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(pmVar27);
            if ((mbedtls_pk_type_t)local_98 != mVar18) goto LAB_00116764;
          }
          else {
            if (2 < ssl->minor_ver) {
              return -0x6c00;
            }
            mVar18 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(pmVar27);
            local_98 = (uchar *)CONCAT44(local_98._4_4_,mVar18);
            mVar37 = (uint)(mVar18 == MBEDTLS_PK_ECDSA) << 2;
          }
          iVar15 = -0x7b00;
          local_b0._0_1_ = '2';
          if (puVar26 + -2 < n) goto LAB_00116764;
          uVar30 = (ulong)(ushort)(*(ushort *)n << 8 | *(ushort *)n >> 8);
          n = n + 2;
          if (n != (long)puVar26 - uVar30) goto LAB_00116764;
          puVar36 = local_a0 + (ulong)(((byte)local_90 & 2) >> 1) * 8 + 4;
          if (mVar37 == MBEDTLS_MD_NONE) {
            iVar15 = mbedtls_ssl_get_key_exchange_md_ssl_tls
                               (ssl,(uchar *)&major_ver,puVar36,sVar20 - (long)puVar36);
            if (iVar15 != 0) {
              return iVar15;
            }
            sVar20 = 0x24;
          }
          else {
            iVar15 = mbedtls_ssl_get_key_exchange_md_tls1_2
                               (ssl,(uchar *)&major_ver,puVar36,sVar20 - (long)puVar36,mVar37);
            if (iVar15 != 0) {
              return iVar15;
            }
            sVar20 = 0;
          }
          pmVar5 = ssl->session_negotiate->peer_cert;
          local_b0._0_1_ = '(';
          if (pmVar5 == (mbedtls_x509_crt *)0x0) {
            iVar15 = -0x7700;
            goto LAB_00116764;
          }
          iVar15 = mbedtls_pk_can_do(&pmVar5->pk,(mbedtls_pk_type_t)local_98);
          if (iVar15 == 0) {
            iVar15 = -0x6d00;
            goto LAB_00116764;
          }
          iVar15 = mbedtls_pk_verify(&ssl->session_negotiate->peer_cert->pk,mVar37,
                                     (uchar *)&major_ver,sVar20,(uchar *)n,uVar30);
          if (iVar15 != 0) {
            local_b0._0_1_ = '3';
            goto LAB_00116764;
          }
        }
      }
      else {
        if ((pmVar27->key_exchange | MBEDTLS_KEY_EXCHANGE_DHE_RSA) != MBEDTLS_KEY_EXCHANGE_RSA_PSK)
        goto LAB_00117201;
        ssl->keep_current_message = 1;
      }
      goto LAB_001162d7;
    }
    ssl->state = 5;
    break;
  case 5:
    mVar3 = ssl->transform_negotiate->ciphersuite_info->key_exchange;
    if ((mVar3 < MBEDTLS_KEY_EXCHANGE_ECJPAKE) && ((0x61eU >> (mVar3 & 0x1f) & 1) != 0)) {
      iVar15 = mbedtls_ssl_read_record(ssl);
      if (iVar15 != 0) {
        return iVar15;
      }
      if (ssl->in_msgtype != 0x16) goto LAB_00117201;
      ssl->state = ssl->state + 1;
      puVar36 = ssl->in_msg;
      uVar12 = *puVar36;
      ssl->client_auth = (uint)(uVar12 == '\r');
      if (uVar12 == '\r') {
        uVar30 = ssl->in_hslen;
        uVar19 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8;
        uVar35 = (ulong)puVar36[uVar19 + 4];
        if (uVar30 < uVar19 + uVar35 + 6) {
LAB_0011615f:
          mbedtls_ssl_send_alert_message(ssl,'\x02','2');
          return -0x7a80;
        }
        if (ssl->minor_ver == 3) {
          uVar39 = (ulong)(ushort)(*(ushort *)(puVar36 + uVar35 + uVar19 + 5) << 8 |
                                  *(ushort *)(puVar36 + uVar35 + uVar19 + 5) >> 8);
          if (uVar30 < uVar19 + uVar35 + uVar39 + 8) goto LAB_0011615f;
          uVar35 = uVar35 + uVar39 + 2;
        }
        if (uVar30 != (uVar19 | 4) + uVar35 +
                      (ulong)(ushort)(*(ushort *)(puVar36 + uVar35 + uVar19 + 5) << 8 |
                                     *(ushort *)(puVar36 + uVar35 + uVar19 + 5) >> 8) + 3)
        goto LAB_0011615f;
      }
      else {
        ssl->keep_current_message = 1;
      }
    }
    else {
      ssl->state = 6;
    }
    break;
  case 6:
    iVar15 = mbedtls_ssl_read_record(ssl);
    if (iVar15 != 0) {
      return iVar15;
    }
    if (ssl->in_msgtype == 0x16) {
      if ((ssl->in_hslen == (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 4) &&
         (*ssl->in_msg == '\x0e')) {
        ssl->state = ssl->state + 1;
        if ((ssl->conf->field_0x174 & 2) != 0) {
          mbedtls_ssl_recv_flight_completed(ssl);
          return 0;
        }
        return 0;
      }
      mbedtls_ssl_send_alert_message(ssl,'\x02','2');
      return -0x7b80;
    }
    return -0x7700;
  case 7:
    iVar15 = mbedtls_ssl_write_certificate(ssl);
    return iVar15;
  case 8:
    pmVar27 = ssl->transform_negotiate->ciphersuite_info;
    mVar3 = pmVar27->key_exchange;
    if (mVar3 < MBEDTLS_KEY_EXCHANGE_ECJPAKE) {
      if ((0x618U >> (mVar3 & 0x1f) & 1) == 0) {
        if (mVar3 != MBEDTLS_KEY_EXCHANGE_DHE_RSA) goto LAB_0011666a;
        _major_ver = (ssl->handshake->dhm_ctx).len;
        ssl->out_msg[4] = (uchar)(_major_ver >> 8);
        ssl->out_msg[5] = (uchar)major_ver;
        pmVar43 = ssl->handshake;
        sVar20 = mbedtls_mpi_size(&(pmVar43->dhm_ctx).P);
        iVar15 = mbedtls_dhm_make_public
                           (&pmVar43->dhm_ctx,(int)sVar20,ssl->out_msg + 6,_major_ver,
                            (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng
                           );
        if (iVar15 != 0) {
          return iVar15;
        }
        pmVar43 = ssl->handshake;
        iVar15 = mbedtls_dhm_calc_secret
                           (&pmVar43->dhm_ctx,pmVar43->premaster,0x424,&pmVar43->pmslen,
                            (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng
                           );
        if (iVar15 != 0) {
          return iVar15;
        }
        sStackY_d0 = 6;
      }
      else {
        iVar15 = mbedtls_ecdhopt_responder
                           (&ssl->handshake->ecdh_ctx,(size_t *)&major_ver,ssl->out_msg + 4,1000,
                            (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng
                           );
        if (iVar15 != 0) {
          return iVar15;
        }
        pmVar43 = ssl->handshake;
        iVar15 = mbedtls_ecdhopt_shared_secret
                           (&pmVar43->ecdh_ctx,&pmVar43->pmslen,pmVar43->premaster,0x400,
                            (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng
                           );
        if (iVar15 != 0) {
          return iVar15;
        }
        sStackY_d0 = 4;
      }
    }
    else {
LAB_0011666a:
      iVar15 = mbedtls_ssl_ciphersuite_uses_psk(pmVar27);
      if (iVar15 == 0) {
        if (pmVar27->key_exchange != MBEDTLS_KEY_EXCHANGE_RSA) {
          return -0x6c00;
        }
        sStackY_d0 = 4;
        iVar15 = ssl_write_encrypted_pms(ssl,4,(size_t *)&major_ver,0);
      }
      else {
        pmVar24 = ssl->conf;
        if (pmVar24->psk == (uchar *)0x0) {
          return -0x7600;
        }
        if (pmVar24->psk_identity == (uchar *)0x0) {
          return -0x7600;
        }
        _major_ver = pmVar24->psk_identity_len;
        if (_major_ver - 0x3ffb < 0xffffffffffffbfff) {
          return -0x6a00;
        }
        ssl->out_msg[4] = (uchar)(_major_ver >> 8);
        ssl->out_msg[5] = (uchar)major_ver;
        memcpy(ssl->out_msg + 6,ssl->conf->psk_identity,ssl->conf->psk_identity_len);
        if (3 < pmVar27->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK) {
          return -0x6c00;
        }
        pmVar24 = ssl->conf;
        sVar20 = pmVar24->psk_identity_len;
        sStackY_d0 = sVar20 + 6;
        switch(pmVar27->key_exchange) {
        case MBEDTLS_KEY_EXCHANGE_PSK:
          _major_ver = 0;
          goto LAB_0011738a;
        case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
          _major_ver = (ssl->handshake->dhm_ctx).len;
          if (0x4000 < _major_ver + sVar20 + 8) {
            return -0x6a00;
          }
          sStackY_d0 = sVar20 + 8;
          ssl->out_msg[sVar20 + 6] = (uchar)(_major_ver >> 8);
          ssl->out_msg[sVar20 + 7] = (uchar)major_ver;
          pmVar43 = ssl->handshake;
          sVar20 = mbedtls_mpi_size(&(pmVar43->dhm_ctx).P);
          iVar15 = mbedtls_dhm_make_public
                             (&pmVar43->dhm_ctx,(int)sVar20,ssl->out_msg + sStackY_d0,_major_ver,
                              (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                              ssl->conf->p_rng);
          break;
        case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
          iVar15 = ssl_write_encrypted_pms(ssl,sStackY_d0,(size_t *)&major_ver,2);
          break;
        case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
          iVar15 = mbedtls_ecdhopt_responder
                             (&ssl->handshake->ecdh_ctx,(size_t *)&major_ver,
                              ssl->out_msg + sStackY_d0,0x3ffa - sVar20,
                              (_func_int_void_ptr_uchar_ptr_size_t *)pmVar24->f_rng,pmVar24->p_rng);
        }
        if (iVar15 != 0) {
          return iVar15;
        }
LAB_0011738a:
        iVar15 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar27->key_exchange);
      }
      if (iVar15 != 0) {
        return iVar15;
      }
    }
    ssl->out_msglen = sStackY_d0 + _major_ver;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x10';
LAB_00116394:
    ssl->state = ssl->state + 1;
    iVar15 = mbedtls_ssl_write_record(ssl);
    return iVar15;
  case 9:
    pmVar27 = ssl->transform_negotiate->ciphersuite_info;
    n = 0;
    iVar15 = mbedtls_ssl_derive_keys(ssl);
    if (iVar15 != 0) {
      return iVar15;
    }
    mVar3 = pmVar27->key_exchange;
    if (((((MBEDTLS_KEY_EXCHANGE_ECJPAKE < mVar3) || ((0x9e0U >> (mVar3 & 0x1f) & 1) == 0)) &&
         (ssl->client_auth != 0)) &&
        (((pmVar43 = ssl->handshake, pmVar43 != (mbedtls_ssl_handshake_params *)0x0 &&
          (pmVar21 = pmVar43->key_cert, pmVar21 != (mbedtls_ssl_key_cert *)0x0)) ||
         (pmVar21 = ssl->conf->key_cert, pmVar21 != (mbedtls_ssl_key_cert *)0x0)))) &&
       (pmVar21->cert != (mbedtls_x509_crt *)0x0)) {
      pmVar22 = mbedtls_ssl_own_key(ssl);
      if (pmVar22 == (mbedtls_pk_context *)0x0) {
        return -0x7600;
      }
      piVar41 = &major_ver;
      (*pmVar43->calc_verify)(ssl,(uchar *)piVar41);
      if (ssl->minor_ver == 3) {
        bVar45 = ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384;
        mVar37 = bVar45 | MBEDTLS_MD_SHA256;
        ssl->out_msg[4] = bVar45 | 4;
        pmVar22 = mbedtls_ssl_own_key(ssl);
        uVar12 = mbedtls_ssl_sig_from_pk(pmVar22);
        ssl->out_msg[5] = uVar12;
        lVar23 = 2;
        sVar20 = 0;
      }
      else {
        pmVar22 = mbedtls_ssl_own_key(ssl);
        mVar37 = MBEDTLS_MD_SHA1;
        iVar15 = mbedtls_pk_can_do(pmVar22,MBEDTLS_PK_ECDSA);
        if (iVar15 == 0) {
          sVar20 = 0x24;
          lVar23 = 0;
          mVar37 = MBEDTLS_MD_NONE;
        }
        else {
          sVar20 = 0x14;
          piVar41 = local_68;
          lVar23 = 0;
        }
      }
      pmVar22 = mbedtls_ssl_own_key(ssl);
      iVar15 = mbedtls_pk_sign(pmVar22,mVar37,(uchar *)piVar41,sVar20,ssl->out_msg + lVar23 + 6,&n,
                               (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                               ssl->conf->p_rng);
      if (iVar15 != 0) {
        return iVar15;
      }
      ssl->out_msg[lVar23 + 4] = n._1_1_;
      ssl->out_msg[lVar23 + 5] = (uchar)n;
      ssl->out_msglen = lVar23 + 6 + n;
      ssl->out_msgtype = 0x16;
      *ssl->out_msg = '\x0f';
      goto LAB_00116394;
    }
LAB_001162d7:
    ssl->state = ssl->state + 1;
    break;
  case 10:
    iVar15 = mbedtls_ssl_write_change_cipher_spec(ssl);
    return iVar15;
  case 0xb:
    iVar15 = mbedtls_ssl_write_finished(ssl);
    return iVar15;
  case 0xc:
    if (ssl->handshake->new_session_ticket == 0) {
      iVar15 = mbedtls_ssl_parse_change_cipher_spec(ssl);
      return iVar15;
    }
    ssl->state = 0x11;
  case 0x11:
    iVar15 = mbedtls_ssl_read_record(ssl);
    if (iVar15 != 0) {
      return iVar15;
    }
    if (ssl->in_msgtype != 0x16) {
LAB_00117201:
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
      return -0x7700;
    }
    puVar36 = ssl->in_msg;
    if (*puVar36 == '\x04') {
      uVar19 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8;
      uVar30 = uVar19 + 10;
      if (uVar30 <= ssl->in_hslen) {
        uVar19 = uVar19 | 4;
        uVar35 = (ulong)(ushort)(*(ushort *)(puVar36 + uVar19 + 4) << 8 |
                                *(ushort *)(puVar36 + uVar19 + 4) >> 8);
        if (uVar30 + uVar35 == ssl->in_hslen) {
          uVar17 = *(uint *)(puVar36 + uVar19);
          ssl->handshake->new_session_ticket = 0;
          ssl->state = 0xc;
          if (uVar35 != 0) {
            puVar26 = ssl->session_negotiate->ticket;
            sVar20 = ssl->session_negotiate->ticket_len;
            for (sVar34 = 0; sVar20 != sVar34; sVar34 = sVar34 + 1) {
              puVar26[sVar34] = '\0';
            }
            free(ssl->session_negotiate->ticket);
            pmVar7 = ssl->session_negotiate;
            puVar26 = (uchar *)calloc(1,uVar35);
            pmVar7->ticket = (uchar *)0x0;
            pmVar7->ticket_len = 0;
            if (puVar26 == (uchar *)0x0) {
              mbedtls_ssl_send_alert_message(ssl,'\x02','P');
              return -0x7f00;
            }
            memcpy(puVar26,puVar36 + uVar19 + 6,uVar35);
            pmVar7->ticket = puVar26;
            pmVar7->ticket_len = uVar35;
            pmVar7->ticket_lifetime =
                 uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18
            ;
            pmVar7->id_len = 0;
          }
          break;
        }
      }
    }
    mbedtls_ssl_send_alert_message(ssl,'\x02','2');
    iVar16 = -0x6e00;
    goto switchD_00115e08_caseD_10;
  case 0xd:
    iVar15 = mbedtls_ssl_parse_finished(ssl);
    return iVar15;
  case 0xe:
    ssl->state = 0xf;
    break;
  case 0xf:
    mbedtls_ssl_handshake_wrapup(ssl);
    break;
  default:
    goto switchD_00115e08_caseD_10;
  }
  iVar16 = 0;
switchD_00115e08_caseD_10:
  return iVar16;
}

Assistant:

int mbedtls_ssl_handshake_client_step( mbedtls_ssl_context *ssl )
{
    int ret = 0;

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER || ssl->handshake == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "client state: %d", ssl->state ) );

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
            return( ret );
    }
#endif

    /* Change state now, so that it is right in mbedtls_ssl_read_record(), used
     * by DTLS for dropping out-of-sequence ChangeCipherSpec records */
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
    if( ssl->state == MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC &&
        ssl->handshake->new_session_ticket != 0 )
    {
        ssl->state = MBEDTLS_SSL_SERVER_NEW_SESSION_TICKET;
    }
#endif

    switch( ssl->state )
    {
        case MBEDTLS_SSL_HELLO_REQUEST:
            ssl->state = MBEDTLS_SSL_CLIENT_HELLO;
            break;

       /*
        *  ==>   ClientHello
        */
       case MBEDTLS_SSL_CLIENT_HELLO:
           ret = ssl_write_client_hello( ssl );
           break;

       /*
        *  <==   ServerHello
        *        Certificate
        *      ( ServerKeyExchange  )
        *      ( CertificateRequest )
        *        ServerHelloDone
        */
       case MBEDTLS_SSL_SERVER_HELLO:
           ret = ssl_parse_server_hello( ssl );
           break;

       case MBEDTLS_SSL_SERVER_CERTIFICATE:
           ret = mbedtls_ssl_parse_certificate( ssl );
           break;

       case MBEDTLS_SSL_SERVER_KEY_EXCHANGE:
           ret = ssl_parse_server_key_exchange( ssl );
           break;

       case MBEDTLS_SSL_CERTIFICATE_REQUEST:
           ret = ssl_parse_certificate_request( ssl );
           break;

       case MBEDTLS_SSL_SERVER_HELLO_DONE:
           ret = ssl_parse_server_hello_done( ssl );
           break;

       /*
        *  ==> ( Certificate/Alert  )
        *        ClientKeyExchange
        *      ( CertificateVerify  )
        *        ChangeCipherSpec
        *        Finished
        */
       case MBEDTLS_SSL_CLIENT_CERTIFICATE:
           ret = mbedtls_ssl_write_certificate( ssl );
           break;

       case MBEDTLS_SSL_CLIENT_KEY_EXCHANGE:
           ret = ssl_write_client_key_exchange( ssl );
           break;

       case MBEDTLS_SSL_CERTIFICATE_VERIFY:
           ret = ssl_write_certificate_verify( ssl );
           break;

       case MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC:
           ret = mbedtls_ssl_write_change_cipher_spec( ssl );
           break;

       case MBEDTLS_SSL_CLIENT_FINISHED:
           ret = mbedtls_ssl_write_finished( ssl );
           break;

       /*
        *  <==   ( NewSessionTicket )
        *        ChangeCipherSpec
        *        Finished
        */
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
       case MBEDTLS_SSL_SERVER_NEW_SESSION_TICKET:
           ret = ssl_parse_new_session_ticket( ssl );
           break;
#endif

       case MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC:
           ret = mbedtls_ssl_parse_change_cipher_spec( ssl );
           break;

       case MBEDTLS_SSL_SERVER_FINISHED:
           ret = mbedtls_ssl_parse_finished( ssl );
           break;

       case MBEDTLS_SSL_FLUSH_BUFFERS:
           MBEDTLS_SSL_DEBUG_MSG( 2, ( "handshake: done" ) );
           ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
           break;

       case MBEDTLS_SSL_HANDSHAKE_WRAPUP:
           mbedtls_ssl_handshake_wrapup( ssl );
           break;

       default:
           MBEDTLS_SSL_DEBUG_MSG( 1, ( "invalid state %d", ssl->state ) );
           return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
   }

    return( ret );
}